

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timedependent.cxx
# Opt level: O3

void __thiscall Time::add(Time *this,TimeDependent *object)

{
  pointer *pppTVar1;
  pointer ppTVar2;
  pointer ppTVar3;
  iterator __position;
  uint i;
  ulong uVar4;
  TimeDependent *local_8;
  
  ppTVar3 = (this->timeObjects).
            super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  __position._M_current =
       (this->timeObjects).super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  uVar4 = 0;
  do {
    if ((ulong)((long)__position._M_current - (long)ppTVar3 >> 3) <= uVar4) {
      if (__position._M_current !=
          (this->timeObjects).super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        *__position._M_current = object;
        pppTVar1 = &(this->timeObjects).
                    super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + 1;
        return;
      }
      local_8 = object;
      std::vector<TimeDependent*,std::allocator<TimeDependent*>>::
      _M_realloc_insert<TimeDependent*const&>
                ((vector<TimeDependent*,std::allocator<TimeDependent*>> *)&this->timeObjects,
                 __position,&local_8);
      return;
    }
    ppTVar2 = ppTVar3 + uVar4;
    uVar4 = (ulong)((int)uVar4 + 1);
  } while (*ppTVar2 != object);
  return;
}

Assistant:

void Time::add( class TimeDependent *object )
{
	// find object in already registered objects
	bool found = false;
	for (uint i=0; !found && i<timeObjects.size(); ++i)
		if (timeObjects[i] == object)
			found = true;

	// add if not found
	if (!found)
		timeObjects.push_back( object );
}